

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderBuiltinVarTests.cpp
# Opt level: O0

IterateResult __thiscall deqp::gles3::Functional::FragCoordXYZCase::iterate(FragCoordXYZCase *this)

{
  code *pcVar1;
  undefined4 uVar2;
  bool bVar3;
  int iVar4;
  deUint32 dVar5;
  int iVar6;
  int iVar7;
  TestLog *log_00;
  RenderContext *pRVar8;
  undefined4 extraout_var;
  RenderTarget *pRVar10;
  PixelFormat *this_00;
  TestError *this_01;
  float *pfVar11;
  char *description;
  float x_;
  float y_;
  float z_;
  RGBA local_3e8;
  undefined1 local_3e4 [3];
  bool isOk;
  Vec4 color;
  Vec3 scaledFC;
  Vec3 fragCoord;
  float z;
  float yf;
  float xf;
  int x;
  int y;
  PrimitiveList local_380;
  allocator<char> local_361;
  string local_360;
  undefined1 local_340 [8];
  VertexArrayBinding posBinding;
  deUint16 adStack_2e8 [2];
  int scaleLoc;
  deUint16 indices [6];
  float positions [16];
  string local_290;
  allocator<char> local_269;
  string local_268;
  allocator<char> local_241;
  string local_240;
  ProgramSources local_220;
  undefined1 local_150 [8];
  ShaderProgram program;
  undefined1 local_70 [8];
  Surface refImg;
  Surface testImg;
  Vec3 scale;
  RGBA local_2c;
  int local_28;
  RGBA threshold;
  int height;
  int width;
  Functions *gl;
  TestLog *log;
  FragCoordXYZCase *this_local;
  long lVar9;
  
  log_00 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  pRVar8 = gles3::Context::getRenderContext((this->super_TestCase).m_context);
  iVar4 = (*pRVar8->_vptr_RenderContext[3])();
  lVar9 = CONCAT44(extraout_var,iVar4);
  pRVar10 = gles3::Context::getRenderTarget((this->super_TestCase).m_context);
  threshold.m_value = tcu::RenderTarget::getWidth(pRVar10);
  pRVar10 = gles3::Context::getRenderTarget((this->super_TestCase).m_context);
  local_28 = tcu::RenderTarget::getHeight(pRVar10);
  tcu::RGBA::RGBA((RGBA *)(scale.m_data + 2),1,1,1,1);
  pRVar10 = gles3::Context::getRenderTarget((this->super_TestCase).m_context);
  this_00 = tcu::RenderTarget::getPixelFormat(pRVar10);
  scale.m_data[1] = (float)tcu::PixelFormat::getColorThreshold(this_00);
  local_2c = tcu::operator+((RGBA *)(scale.m_data + 2),(RGBA *)(scale.m_data + 1));
  tcu::Vector<float,_3>::Vector
            ((Vector<float,_3> *)&testImg.m_pixels.m_cap,1.0 / (float)(int)threshold.m_value,
             1.0 / (float)local_28,1.0);
  tcu::Surface::Surface((Surface *)&refImg.m_pixels.m_cap,threshold.m_value,local_28);
  tcu::Surface::Surface((Surface *)local_70,threshold.m_value,local_28);
  pRVar8 = gles3::Context::getRenderContext((this->super_TestCase).m_context);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_240,
             "#version 300 es\nin highp vec4 a_position;\nvoid main (void)\n{\n\tgl_Position = a_position;\n}\n"
             ,&local_241);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_268,
             "#version 300 es\nuniform highp vec3 u_scale;\nlayout(location = 0) out mediump vec4 o_color;\nvoid main (void)\n{\n\to_color = vec4(gl_FragCoord.xyz*u_scale, 1.0);\n}\n"
             ,&local_269);
  glu::makeVtxFragSources(&local_220,&local_240,&local_268);
  glu::ShaderProgram::ShaderProgram((ShaderProgram *)local_150,pRVar8,&local_220);
  glu::ProgramSources::~ProgramSources(&local_220);
  std::__cxx11::string::~string((string *)&local_268);
  std::allocator<char>::~allocator(&local_269);
  std::__cxx11::string::~string((string *)&local_240);
  std::allocator<char>::~allocator(&local_241);
  glu::operator<<(log_00,(ShaderProgram *)local_150);
  bVar3 = glu::ShaderProgram::isOk((ShaderProgram *)local_150);
  if (!bVar3) {
    positions[0xf]._2_1_ = 1;
    this_01 = (TestError *)__cxa_allocate_exception(0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_290,"Compile failed",(allocator<char> *)((long)positions + 0x3f));
    tcu::TestError::TestError(this_01,&local_290);
    positions[0xf]._2_1_ = 0;
    __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  positions[10] = 1.0;
  positions[0xb] = -1.0;
  positions[0xc] = 1.0;
  positions[0xd] = 1.0;
  positions[6] = 1.0;
  positions[7] = 1.0;
  positions[8] = 0.0;
  positions[9] = 1.0;
  positions[2] = -1.0;
  positions[3] = -1.0;
  positions[4] = 0.0;
  positions[5] = 1.0;
  stack0xfffffffffffffd28 = 0x3f800000bf800000;
  positions[0] = -1.0;
  positions[1] = 1.0;
  _adStack_2e8 = 0x2000200010000;
  indices[0] = 1;
  indices[1] = 3;
  pcVar1 = *(code **)(lVar9 + 0xb48);
  dVar5 = glu::ShaderProgram::getProgram((ShaderProgram *)local_150);
  posBinding.pointer.data._4_4_ = (*pcVar1)(dVar5,"u_scale");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_360,"a_position",&local_361);
  glu::va::Float((VertexArrayBinding *)local_340,&local_360,4,4,0,(float *)(indices + 4));
  std::__cxx11::string::~string((string *)&local_360);
  std::allocator<char>::~allocator(&local_361);
  pcVar1 = *(code **)(lVar9 + 0x1680);
  dVar5 = glu::ShaderProgram::getProgram((ShaderProgram *)local_150);
  (*pcVar1)(dVar5);
  uVar2 = posBinding.pointer.data._4_4_;
  pcVar1 = *(code **)(lVar9 + 0x1568);
  pfVar11 = tcu::Vector<float,_3>::getPtr((Vector<float,_3> *)&testImg.m_pixels.m_cap);
  (*pcVar1)(uVar2,1,pfVar11);
  pRVar8 = gles3::Context::getRenderContext((this->super_TestCase).m_context);
  dVar5 = glu::ShaderProgram::getProgram((ShaderProgram *)local_150);
  glu::pr::Triangles(&local_380,6,adStack_2e8);
  glu::draw(pRVar8,dVar5,1,(VertexArrayBinding *)local_340,&local_380,(DrawUtilCallback *)0x0);
  pRVar8 = gles3::Context::getRenderContext((this->super_TestCase).m_context);
  tcu::Surface::getAccess((PixelBufferAccess *)&x,(Surface *)&refImg.m_pixels.m_cap);
  glu::readPixels(pRVar8,0,0,(PixelBufferAccess *)&x);
  dVar5 = (**(code **)(lVar9 + 0x800))();
  glu::checkError(dVar5,"Draw",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fShaderBuiltinVarTests.cpp"
                  ,0x15b);
  glu::VertexArrayBinding::~VertexArrayBinding((VertexArrayBinding *)local_340);
  xf = 0.0;
  while( true ) {
    iVar4 = tcu::Surface::getHeight((Surface *)local_70);
    if (iVar4 <= (int)xf) break;
    yf = 0.0;
    while( true ) {
      iVar4 = tcu::Surface::getWidth((Surface *)local_70);
      if (iVar4 <= (int)yf) break;
      iVar4 = tcu::Surface::getWidth((Surface *)local_70);
      iVar6 = tcu::Surface::getHeight((Surface *)local_70);
      iVar7 = tcu::Surface::getHeight((Surface *)local_70);
      tcu::Vector<float,_3>::Vector
                ((Vector<float,_3> *)(scaledFC.m_data + 1),(float)(int)yf + 0.5,(float)(int)xf + 0.5
                 ,(((float)(int)yf + 0.5) / (float)iVar4 +
                  ((float)(int)(~(uint)xf + iVar6) + 0.5) / (float)iVar7) * 0.5);
      tcu::operator*((tcu *)(color.m_data + 2),(Vector<float,_3> *)(scaledFC.m_data + 1),
                     (Vector<float,_3> *)&testImg.m_pixels.m_cap);
      x_ = tcu::Vector<float,_3>::x((Vector<float,_3> *)(color.m_data + 2));
      y_ = tcu::Vector<float,_3>::y((Vector<float,_3> *)(color.m_data + 2));
      z_ = tcu::Vector<float,_3>::z((Vector<float,_3> *)(color.m_data + 2));
      tcu::Vector<float,_4>::Vector((Vector<float,_4> *)local_3e4,x_,y_,z_,1.0);
      tcu::RGBA::RGBA(&local_3e8,(Vec4 *)local_3e4);
      tcu::Surface::setPixel((Surface *)local_70,(int)yf,(int)xf,local_3e8);
      yf = (float)((int)yf + 1);
    }
    xf = (float)((int)xf + 1);
  }
  bVar3 = tcu::pixelThresholdCompare
                    (log_00,"Result","Image comparison result",(Surface *)local_70,
                     (Surface *)&refImg.m_pixels.m_cap,&local_2c,COMPARE_LOG_RESULT);
  description = "Image comparison failed";
  if (bVar3) {
    description = "Pass";
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
             (byte)~bVar3 & QP_TEST_RESULT_FAIL,description);
  glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_150);
  tcu::Surface::~Surface((Surface *)local_70);
  tcu::Surface::~Surface((Surface *)&refImg.m_pixels.m_cap);
  return STOP;
}

Assistant:

IterateResult iterate (void)
	{
		TestLog&				log			= m_testCtx.getLog();
		const glw::Functions&	gl			= m_context.getRenderContext().getFunctions();
		const int				width		= m_context.getRenderTarget().getWidth();
		const int				height		= m_context.getRenderTarget().getHeight();
		const tcu::RGBA			threshold	= tcu::RGBA(1,1,1,1) + m_context.getRenderTarget().getPixelFormat().getColorThreshold();
		const tcu::Vec3			scale		(1.f / float(width), 1.f / float(height), 1.0f);

		tcu::Surface			testImg		(width, height);
		tcu::Surface			refImg		(width, height);

		const glu::ShaderProgram program(m_context.getRenderContext(), glu::makeVtxFragSources(
			"#version 300 es\n"
			"in highp vec4 a_position;\n"
			"void main (void)\n"
			"{\n"
			"	gl_Position = a_position;\n"
			"}\n",

			"#version 300 es\n"
			"uniform highp vec3 u_scale;\n"
			"layout(location = 0) out mediump vec4 o_color;\n"
			"void main (void)\n"
			"{\n"
			"	o_color = vec4(gl_FragCoord.xyz*u_scale, 1.0);\n"
			"}\n"));

		log << program;

		if (!program.isOk())
			throw tcu::TestError("Compile failed");

		// Draw with GL.
		{
			const float positions[] =
			{
				-1.0f,  1.0f, -1.0f, 1.0f,
				-1.0f, -1.0f,  0.0f, 1.0f,
				 1.0f,  1.0f,  0.0f, 1.0f,
				 1.0f, -1.0f,  1.0f, 1.0f
			};
			const deUint16 indices[] = { 0, 1, 2, 2, 1, 3 };

			const int				scaleLoc	= gl.getUniformLocation(program.getProgram(), "u_scale");
			glu::VertexArrayBinding	posBinding	= glu::va::Float("a_position", 4, 4, 0, &positions[0]);

			gl.useProgram(program.getProgram());
			gl.uniform3fv(scaleLoc, 1, scale.getPtr());

			glu::draw(m_context.getRenderContext(), program.getProgram(), 1, &posBinding,
					  glu::pr::Triangles(DE_LENGTH_OF_ARRAY(indices), &indices[0]));

			glu::readPixels(m_context.getRenderContext(), 0, 0, testImg.getAccess());
			GLU_EXPECT_NO_ERROR(gl.getError(), "Draw");
		}

		// Draw reference
		for (int y = 0; y < refImg.getHeight(); y++)
		{
			for (int x = 0; x < refImg.getWidth(); x++)
			{
				const float			xf			= (float(x)+.5f) / float(refImg.getWidth());
				const float			yf			= (float(refImg.getHeight()-y-1)+.5f) / float(refImg.getHeight());
				const float			z			= (xf + yf) / 2.0f;
				const tcu::Vec3		fragCoord	(float(x)+.5f, float(y)+.5f, z);
				const tcu::Vec3		scaledFC	= fragCoord*scale;
				const tcu::Vec4		color		(scaledFC.x(), scaledFC.y(), scaledFC.z(), 1.0f);

				refImg.setPixel(x, y, tcu::RGBA(color));
			}
		}

		// Compare
		{
			bool isOk = tcu::pixelThresholdCompare(log, "Result", "Image comparison result", refImg, testImg, threshold, tcu::COMPARE_LOG_RESULT);
			m_testCtx.setTestResult(isOk ? QP_TEST_RESULT_PASS	: QP_TEST_RESULT_FAIL,
									isOk ? "Pass"				: "Image comparison failed");
		}

		return STOP;
	}